

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O2

void crnlib::SkipMatchesSpec
               (UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
               UInt32 _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue)

{
  byte bVar1;
  uint uVar2;
  UInt32 *pUVar3;
  uint uVar4;
  byte bVar5;
  UInt32 *pUVar6;
  uint uVar7;
  UInt32 UVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  UInt32 *local_40;
  
  pUVar3 = son + _cyclicBufferPos * 2;
  local_40 = son + (ulong)(_cyclicBufferPos * 2) + 1;
  uVar4 = 0;
  uVar7 = 0;
  while ((bVar11 = cutValue != 0, cutValue = cutValue - 1, bVar11 &&
         (uVar2 = pos - curMatch, uVar2 < _cyclicBufferSize))) {
    UVar8 = 0;
    if (_cyclicBufferPos < uVar2) {
      UVar8 = _cyclicBufferSize;
    }
    uVar9 = uVar7;
    if (uVar4 < uVar7) {
      uVar9 = uVar4;
    }
    uVar10 = (ulong)uVar9;
    pUVar6 = son + ((_cyclicBufferPos - uVar2) + UVar8) * 2;
    bVar5 = cur[uVar10 - uVar2];
    bVar1 = cur[uVar10];
    while( true ) {
      uVar9 = (uint)uVar10;
      if (bVar5 != bVar1) break;
      if (lenLimit - 1 == uVar9) {
        *pUVar3 = *pUVar6;
        UVar8 = pUVar6[1];
        goto LAB_00183537;
      }
      uVar10 = (ulong)(uVar9 + 1);
      bVar5 = cur[uVar10 - uVar2];
      bVar1 = cur[uVar10];
    }
    if (bVar5 < bVar1) {
      *pUVar3 = curMatch;
      pUVar3 = pUVar6 + 1;
      pUVar6 = pUVar3;
      uVar7 = uVar9;
    }
    else {
      *local_40 = curMatch;
      uVar4 = uVar9;
      local_40 = pUVar6;
    }
    curMatch = *pUVar6;
  }
  *pUVar3 = 0;
  UVar8 = 0;
LAB_00183537:
  *local_40 = UVar8;
  return;
}

Assistant:

static void SkipMatchesSpec(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte* cur, CLzRef* son,
                            UInt32 _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue) {
  CLzRef* ptr0 = son + (_cyclicBufferPos << 1) + 1;
  CLzRef* ptr1 = son + (_cyclicBufferPos << 1);
  UInt32 len0 = 0, len1 = 0;
  for (;;) {
    UInt32 delta = pos - curMatch;
    if (cutValue-- == 0 || delta >= _cyclicBufferSize) {
      *ptr0 = *ptr1 = kEmptyHashValue;
      return;
    }
    {
      CLzRef* pair = son + ((_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)) << 1);
      const Byte* pb = cur - delta;
      UInt32 len = (len0 < len1 ? len0 : len1);
      if (pb[len] == cur[len]) {
        while (++len != lenLimit)
          if (pb[len] != cur[len])
            break;
        {
          if (len == lenLimit) {
            *ptr1 = pair[0];
            *ptr0 = pair[1];
            return;
          }
        }
      }
      if (pb[len] < cur[len]) {
        *ptr1 = curMatch;
        ptr1 = pair + 1;
        curMatch = *ptr1;
        len1 = len;
      } else {
        *ptr0 = curMatch;
        ptr0 = pair;
        curMatch = *ptr0;
        len0 = len;
      }
    }
  }
}